

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.h
# Opt level: O1

void __thiscall
DumpWrapperToFileCommand::wrapperAction(DumpWrapperToFileCommand *this,ExeElementWrapper *wrapper)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  QString fileName;
  QArrayData *local_68;
  undefined8 *local_60;
  long local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  QString local_30;
  
  if (wrapper != (ExeElementWrapper *)0x0) {
    iVar1 = (*(wrapper->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x11])(wrapper);
    makeFileName(&local_30,this,CONCAT44(extraout_var,iVar1));
    AbstractFileBuffer::dump(&local_30,&wrapper->super_AbstractByteBuffer,true);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dumped size: ",0xd);
    *(uint *)(std::_Rb_tree_decrement + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::_Rb_tree_decrement + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," into: ",7);
    QString::toUtf8_helper((QString *)&local_68);
    if (local_60 == (undefined8 *)0x0) {
      local_60 = &QByteArray::_empty;
    }
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,local_60,(long)local_60 + local_58);
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,1,8);
      }
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_50,local_48);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,8);
      }
    }
  }
  return;
}

Assistant:

virtual void wrapperAction(ExeElementWrapper *wrapper)
    {
        if (!wrapper) {
            return;
        }
        QString fileName = makeFileName(wrapper->getOffset());
        bufsize_t dSize = FileBuffer::dump(fileName, *wrapper, true);
        std::cout << "Dumped size: " << std::hex << "0x" << dSize 
            << " into: " << fileName.toStdString()
            << std::endl;
    }